

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeConstraint::ShapeConstraint(ShapeConstraint *this,string *name)

{
  ShapeRange::ShapeRange(&this->_sequenceRange);
  ShapeRange::ShapeRange(&this->_batchRange);
  ShapeRange::ShapeRange(&this->_channelRange);
  ShapeRange::ShapeRange(&this->_heightRange);
  ShapeRange::ShapeRange(&this->_widthRange);
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  return;
}

Assistant:

ShapeConstraint::ShapeConstraint(const std::string& name)
:
_name(name) {}